

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::BeginLoopIfCharInst::Exec
          (BeginLoopIfCharInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  LoopInfo *pLVar3;
  GroupInfo *this_00;
  undefined4 *puVar4;
  uint8 *puVar5;
  int local_54;
  int i;
  LoopInfo *loopInfo;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  BeginLoopIfCharInst *this_local;
  
  Matcher::CompStats(matcher);
  if ((*inputOffset < inputLength) && (input[*inputOffset] == (this->super_CharMixin).c)) {
    pLVar3 = Matcher::LoopIdToLoopInfo
                       (matcher,(this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
    for (local_54 = (this->super_BodyGroupsMixin).minBodyGroupId;
        local_54 <= (this->super_BodyGroupsMixin).maxBodyGroupId; local_54 = local_54 + 1) {
      this_00 = Matcher::GroupIdToGroupInfo(matcher,local_54);
      bVar2 = GroupInfo::IsUndefined(this_00);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0xbf5,"(matcher.GroupIdToGroupInfo(i)->IsUndefined())",
                           "matcher.GroupIdToGroupInfo(i)->IsUndefined()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    pLVar3->number = 0;
    *instPointer = *instPointer + 0x1d;
    this_local._7_1_ = false;
  }
  else if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower == 0) {
    puVar5 = Matcher::LabelToInstPointer(matcher,(this->super_BeginLoopMixin).exitLabel);
    *instPointer = puVar5;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  return this_local._7_1_;
}

Assistant:

inline bool BeginLoopIfCharInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && input[inputOffset] == c)
        {
            // Commit to at least one iteration of loop
            LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

            // All inner groups must begin reset
#if DBG
            for (int i = minBodyGroupId; i <= maxBodyGroupId; i++)
            {
                Assert(matcher.GroupIdToGroupInfo(i)->IsUndefined());
            }
#endif
            loopInfo->number = 0;
            instPointer += sizeof(*this);
            return false;
        }

        if (repeats.lower > 0)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        instPointer = matcher.LabelToInstPointer(exitLabel);
        return false;
    }